

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

CopyStatus cmsys::SystemTools::CopyFileIfDifferent(string *source,string *destination)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  CopyStatus CVar8;
  string new_destination;
  __string_type __str;
  string new_destination_1;
  string local_a8;
  ulong *local_88;
  ulong local_80;
  ulong local_78 [2];
  string local_68;
  string local_48;
  
  bVar3 = FileIsDirectory(destination);
  if (!bVar3) {
    bVar3 = FilesDiffer(source,destination);
    if (bVar3) {
      CVar8 = CopyFileAlways(source,destination);
      return CVar8;
    }
    goto LAB_005a696f;
  }
  pcVar2 = (destination->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + destination->_M_string_length);
  ConvertToUnixSlashes(&local_48);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_80,0,'\x01');
  GetFilenameName(&local_68,source);
  uVar6 = 0xf;
  if (local_88 != local_78) {
    uVar6 = local_78[0];
  }
  if (uVar6 < local_68._M_string_length + local_80) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_68._M_string_length + local_80) goto LAB_005a6837;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_005a6837:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8.field_2._8_8_ = puVar5[3];
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_a8._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_a8._M_string_length == destination->_M_string_length) {
    if (local_a8._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar4 = bcmp(local_a8._M_dataplus._M_p,(destination->_M_dataplus)._M_p,
                   local_a8._M_string_length);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (!bVar3) {
    CVar8 = CopyFileIfDifferent(source,&local_a8);
    destination = (string *)CVar8.super_Status;
    source = (string *)(ulong)CVar8.Path;
  }
  CVar8.Path = (WhichPath)source;
  CVar8.super_Status = (Status)destination;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    return CVar8;
  }
LAB_005a696f:
  return (CopyStatus)ZEXT812(0);
}

Assistant:

SystemTools::CopyStatus SystemTools::CopyFileIfDifferent(
  std::string const& source, std::string const& destination)
{
  // special check for a destination that is a directory
  // FilesDiffer does not handle file to directory compare
  if (SystemTools::FileIsDirectory(destination)) {
    const std::string new_destination = FileInDir(source, destination);
    if (!SystemTools::ComparePath(new_destination, destination)) {
      return SystemTools::CopyFileIfDifferent(source, new_destination);
    }
  } else {
    // source and destination are files so do a copy if they
    // are different
    if (SystemTools::FilesDiffer(source, destination)) {
      return SystemTools::CopyFileAlways(source, destination);
    }
  }
  // at this point the files must be the same so return true
  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
}